

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_exp.cpp
# Opt level: O2

FxExpression * ParseExpressionM(FScanner *sc,PClassActor *cls)

{
  bool bVar1;
  FxBinaryLogical *base;
  FxExpression *pFVar2;
  FxBinaryLogical *this;
  FxExpression *pFVar3;
  FxConditional *this_00;
  FxAssign *pFVar4;
  FxAssignSelf *this_01;
  int iVar5;
  PClassActor *size;
  size_t size_00;
  FScriptPosition *this_02;
  FScriptPosition local_40;
  
  base = (FxBinaryLogical *)ParseExpressionK(sc,cls);
  while (bVar1 = FScanner::CheckToken(sc,0x11c), bVar1) {
    size = cls;
    pFVar2 = ParseExpressionK(sc,cls);
    this = (FxBinaryLogical *)FxExpression::operator_new((FxExpression *)0x50,(size_t)size);
    FxBinaryLogical::FxBinaryLogical(this,0x11c,&base->super_FxExpression,pFVar2);
    base = this;
  }
  bVar1 = FScanner::CheckToken(sc,0x3f);
  if (bVar1) {
    pFVar2 = ParseExpressionM(sc,cls);
    FScanner::MustGetToken(sc,0x3a);
    pFVar3 = ParseExpressionM(sc,cls);
    this_00 = (FxConditional *)FxExpression::operator_new((FxExpression *)0x40,(size_t)cls);
    FxConditional::FxConditional(this_00,&base->super_FxExpression,pFVar2,pFVar3);
    return &this_00->super_FxExpression;
  }
  size_00 = 0x3d;
  bVar1 = FScanner::CheckToken(sc,0x3d);
  if (bVar1) {
    pFVar2 = ParseExpressionM(sc,cls);
    pFVar4 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x48,(size_t)cls);
    FxAssign::FxAssign(pFVar4,&base->super_FxExpression,pFVar2,false);
    return &pFVar4->super_FxExpression;
  }
  this_01 = (FxAssignSelf *)FxExpression::operator_new((FxExpression *)0x30,size_00);
  this_02 = &local_40;
  FScriptPosition::FScriptPosition(this_02,sc);
  FxAssignSelf::FxAssignSelf(this_01,this_02);
  FString::~FString(&local_40.FileName);
  FScanner::GetToken(sc);
  switch(sc->TokenType) {
  case 0x10b:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x116;
    break;
  case 0x10c:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x117;
    break;
  case 0x10d:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x118;
    break;
  case 0x10e:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x2b;
    goto LAB_0051e390;
  case 0x10f:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x2d;
LAB_0051e390:
    FxAddSub::FxAddSub((FxAddSub *)pFVar2,iVar5,(FxExpression *)this_01,(FxExpression *)0x0);
    goto LAB_0051e427;
  case 0x110:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x2a;
    goto LAB_0051e3ed;
  case 0x111:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x2f;
    goto LAB_0051e3ed;
  case 0x112:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x25;
LAB_0051e3ed:
    FxMulDiv::FxMulDiv((FxMulDiv *)pFVar2,iVar5,(FxExpression *)this_01,(FxExpression *)0x0);
    goto LAB_0051e427;
  case 0x113:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x26;
    goto LAB_0051e419;
  case 0x114:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x5e;
    goto LAB_0051e419;
  case 0x115:
    pFVar2 = (FxExpression *)FxExpression::operator_new((FxExpression *)0x40,(size_t)this_02);
    iVar5 = 0x7c;
LAB_0051e419:
    FxBitOp::FxBitOp((FxBitOp *)pFVar2,iVar5,(FxExpression *)this_01,(FxExpression *)0x0);
    goto LAB_0051e427;
  default:
    FScanner::UnGet(sc);
    (*(this_01->super_FxExpression)._vptr_FxExpression[1])(this_01);
    return &base->super_FxExpression;
  }
  FxShift::FxShift((FxShift *)pFVar2,iVar5,(FxExpression *)this_01,(FxExpression *)0x0);
LAB_0051e427:
  pFVar3 = ParseExpressionM(sc,cls);
  *(FxExpression **)&pFVar2[1].ScriptPosition.ScriptLine = pFVar3;
  pFVar4 = (FxAssign *)FxExpression::operator_new((FxExpression *)0x48,(size_t)cls);
  FxAssign::FxAssign(pFVar4,&base->super_FxExpression,pFVar2,true);
  this_01->Assignment = pFVar4;
  return &pFVar4->super_FxExpression;
}

Assistant:

static FxExpression *ParseExpressionM (FScanner &sc, PClassActor *cls)
{
	FxExpression *base = ParseExpressionL (sc, cls);

	if (sc.CheckToken('?'))
	{
		FxExpression *truex = ParseExpressionM (sc, cls);
		sc.MustGetToken(':');
		FxExpression *falsex = ParseExpressionM (sc, cls);
		return new FxConditional(base, truex, falsex);
	}
	else if (sc.CheckToken('='))
	{
		FxExpression *right = ParseExpressionM(sc, cls);
		return new FxAssign(base, right);
	}
	else
	{
		FxBinary *exp;
		FxAssignSelf *left = new FxAssignSelf(sc);

		sc.GetToken();
		switch (sc.TokenType)
		{
		case TK_AddEq:
			exp = new FxAddSub('+', left, nullptr);
			break;

		case TK_SubEq:
			exp = new FxAddSub('-', left, nullptr);
			break;

		case TK_MulEq:
			exp = new FxMulDiv('*', left, nullptr);
			break;

		case TK_DivEq:
			exp = new FxMulDiv('/', left, nullptr);
			break;

		case TK_ModEq:
			exp = new FxMulDiv('%', left, nullptr);
			break;

		case TK_LShiftEq:
			exp = new FxShift(TK_LShift, left, nullptr);
			break;

		case TK_RShiftEq:
			exp = new FxShift(TK_RShift, left, nullptr);
			break;

		case TK_URShiftEq:
			exp = new FxShift(TK_URShift, left, nullptr);
			break;

		case TK_AndEq:
			exp = new FxBitOp('&', left, nullptr);
			break;

		case TK_XorEq:
			exp = new FxBitOp('^', left, nullptr);
			break;

		case TK_OrEq:
			exp = new FxBitOp('|', left, nullptr);
			break;

		default:
			sc.UnGet();
			delete left;
			return base;
		}

		exp->right = ParseExpressionM(sc, cls);

		FxAssign *ret = new FxAssign(base, exp, true);
		left->Assignment = ret;
		return ret;
	}
}